

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O1

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteMessage<google::protobuf::json_internal::UnparseProto3Type>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto3Type> *msg,
          Desc<google::protobuf::json_internal::UnparseProto3Type> *desc,bool is_top_level)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  anon_class_32_4_9609453f body;
  bool bVar5;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aVar6;
  Msg *msg_00;
  bool bVar7;
  MessageType MVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  size_t *psVar12;
  Field pFVar13;
  size_t sVar14;
  JsonWriter *pJVar15;
  uint uVar16;
  size_t sVar17;
  char *pcVar18;
  undefined8 uVar19;
  uint uVar20;
  anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
  *this_00;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aVar21;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 *paVar22;
  int iVar23;
  uint uVar24;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aVar25;
  int iVar26;
  string_view name;
  anon_class_16_2_3789d670 body_00;
  anon_class_16_2_3789d670 body_01;
  bool has_value;
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> type_url;
  StatusOr<int> nanos;
  bool first;
  Field value_field;
  undefined1 local_141;
  anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
  local_140;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_138;
  ulong uStack_130;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_128;
  ulong uStack_120;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_118;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aStack_110;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_108;
  Msg<google::protobuf::json_internal::UnparseProto3Type> *pMStack_100;
  uint local_f4;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_f0;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_e8;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aStack_e0;
  code *local_d8;
  ulong local_d0;
  code *local_c8;
  ulong local_c0;
  code *local_b8;
  ulong local_b0;
  code *local_a8;
  ulong local_a0;
  code *local_98;
  long local_90;
  code *local_88;
  ulong local_80;
  code *local_78;
  anon_unknown_4 *local_70;
  Msg *local_68;
  size_t local_60;
  string *local_58;
  Field local_50;
  size_t local_48;
  Field local_40;
  char *local_38;
  
  sVar17 = (size_t)is_top_level;
  psVar12 = (size_t *)
            ((ulong)(desc->raw_).field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  name._M_str = (char *)msg;
  name._M_len = *psVar12;
  MVar8 = ClassifyMessage((json_internal *)psVar12[1],name);
  switch(MVar8) {
  case kAny:
    pFVar13 = Proto3Type::MustHaveField(desc,1);
    local_40 = Proto3Type::MustHaveField(desc,2);
    sVar17 = UntypedMessage::Count(msg,(pFVar13->raw_->field_0)._impl_.number_);
    sVar14 = UntypedMessage::Count(msg,(local_40->raw_->field_0)._impl_.number_);
    local_141 = sVar14 != 0;
    if (sVar14 != 0 || sVar17 != 0) {
      if (sVar17 == 0) {
        pcVar18 = "broken Any: missing type URL";
        uVar19 = 0x1c;
LAB_002d4720:
        absl::lts_20240722::InvalidArgumentError(this,uVar19,pcVar18);
        return (Status)(uintptr_t)this;
      }
      if ((sVar14 == 0) && ((writer->options_).allow_legacy_syntax == false)) {
        pcVar18 = "broken Any: missing value";
        uVar19 = 0x19;
        goto LAB_002d4720;
      }
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
      writer->indent_ = writer->indent_ + 1;
      UnparseProto3Type::GetString
                ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 &local_140.status_,pFVar13,&writer->scratch_buf_,msg,0);
      *(anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
        *)this = local_140;
      if (((ulong)local_140 & 1) == 0) {
        LOCK();
        *(int *)local_140 = *(int *)local_140 + 1;
        UNLOCK();
      }
      if (*(long *)this != 1) {
LAB_002d3f44:
        this_00 = &local_140;
        goto LAB_002d4659;
      }
      absl::lts_20240722::Status::~Status((Status *)this);
      JsonWriter::NewLine(writer);
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"\"@type\":",8);
      if ((writer->options_).add_whitespace == true) {
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_," ",1);
      }
      if (local_140 ==
          (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
           )0x1) {
        local_128 = local_138;
        uStack_120 = uStack_130;
        JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
                  (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          &local_128.status_);
        if (local_140 ==
            (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
             )0x1) {
          local_f0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&aStack_e0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,uStack_130,uStack_130 + (long)local_138);
          local_118 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&local_141;
          aStack_110 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&local_40;
          body.value_field = (Field *)aStack_110;
          body.has_value = (bool *)local_118;
          body.writer = writer;
          body.msg = msg;
          local_108 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)writer;
          pMStack_100 = msg;
          Proto3Type::
          WithDynamicType<google::protobuf::json_internal::(anonymous_namespace)::WriteAny<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&)::_lambda(google::protobuf::json_internal::ResolverPool::Message_const&)_1_>
                    ((Desc *)this,(string *)desc,body);
          if (local_f0 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&aStack_e0) {
            operator_delete((void *)local_f0,(long)aStack_e0 + 1);
          }
          goto LAB_002d3f44;
        }
      }
      else {
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_140.status_);
      }
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_140.status_);
      paVar22 = &local_128;
LAB_002d4f2a:
      absl::lts_20240722::internal_statusor::Helper::Crash(&paVar22->status_);
LAB_002d4f2f:
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_f0.status_);
LAB_002d4f3c:
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_f0.status_);
LAB_002d4f49:
      pcVar18 = 
      "google.protobuf.Value cannot encode double values for nan, because it would be parsed as a string"
      ;
      uVar19 = 0x61;
LAB_002d4531:
      absl::lts_20240722::InvalidArgumentError(this,uVar19,pcVar18);
LAB_002d486d:
      absl::lts_20240722::internal_statusor::StatusOrData<double>::~StatusOrData
                ((StatusOrData<double> *)&local_f0.status_);
      return (Status)(uintptr_t)this;
    }
    pcVar18 = "{}";
    sVar17 = 2;
    goto LAB_002d4471;
  case kWrapper:
    pFVar13 = Proto3Type::MustHaveField(desc,1);
    sVar17 = UntypedMessage::Count(msg,(pFVar13->raw_->field_0)._impl_.number_);
    if (sVar17 == 0) {
      WriteSingular<google::protobuf::json_internal::UnparseProto3Type>(this,writer,pFVar13);
    }
    else {
      (anonymous_namespace)::
      WriteSingular<google::protobuf::json_internal::UnparseProto3Type,google::protobuf::json_internal::UntypedMessage_const&>
                ((_anonymous_namespace_ *)this,writer,pFVar13,msg);
    }
    break;
  case kStruct:
    pFVar13 = Proto3Type::MustHaveField(desc,1);
    WriteMap<google::protobuf::json_internal::UnparseProto3Type>(this,writer,msg,pFVar13);
    break;
  case kList:
    pFVar13 = Proto3Type::MustHaveField(desc,1);
    WriteRepeated<google::protobuf::json_internal::UnparseProto3Type>(this,writer,msg,pFVar13);
    break;
  case kValue:
    pFVar13 = Proto3Type::MustHaveField(desc,1);
    sVar14 = UntypedMessage::Count(msg,(pFVar13->raw_->field_0)._impl_.number_);
    if (sVar14 != 0) {
      pcVar18 = "null";
      sVar17 = 4;
      goto LAB_002d4471;
    }
    pFVar13 = Proto3Type::MustHaveField(desc,2);
    sVar14 = UntypedMessage::Count(msg,(pFVar13->raw_->field_0)._impl_.number_);
    if (sVar14 != 0) {
      UnparseProto3Type::GetDouble((UnparseProto3Type *)&local_f0.status_,pFVar13,msg,0);
      *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_f0;
      if (((ulong)local_f0 & 1) == 0) {
        LOCK();
        *(int *)local_f0 = *(int *)local_f0 + 1;
        UNLOCK();
      }
      if (*(long *)this != 1) goto LAB_002d486d;
      absl::lts_20240722::Status::~Status((Status *)this);
      if (local_f0 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_f0.status_);
LAB_002d4f11:
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_140.status_);
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_128.status_);
LAB_002d4f25:
        paVar22 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)&local_140;
        goto LAB_002d4f2a;
      }
      if (NAN((double)local_e8)) goto LAB_002d4f49;
      if (((ulong)local_e8 & 0x7fffffffffffffff) != 0x7ff0000000000000) {
        JsonWriter::Write(writer,(double)local_e8);
        *(undefined8 *)this = 1;
        goto LAB_002d486d;
      }
      pcVar18 = 
      "google.protobuf.Value cannot encode double values for infinity, because it would be parsed as a string"
      ;
      uVar19 = 0x66;
      goto LAB_002d4531;
    }
    pFVar13 = Proto3Type::MustHaveField(desc,3);
    sVar14 = UntypedMessage::Count(msg,(pFVar13->raw_->field_0)._impl_.number_);
    if (sVar14 != 0) {
      UnparseProto3Type::GetString
                ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 &local_f0.status_,pFVar13,&writer->scratch_buf_,msg,0);
      *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_f0;
      if (((ulong)local_f0 & 1) == 0) {
        LOCK();
        *(int *)local_f0 = *(int *)local_f0 + 1;
        UNLOCK();
      }
      if (*(long *)this == 1) {
        absl::lts_20240722::Status::~Status((Status *)this);
        if (local_f0 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002d4f2f;
        local_118 = local_e8;
        aStack_110 = aStack_e0;
        JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
                  (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          &local_118.status_);
        *(undefined8 *)this = 1;
      }
LAB_002d4651:
      this_00 = (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                 *)&local_f0;
LAB_002d4659:
      absl::lts_20240722::internal_statusor::
      StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 &this_00->status_);
      return (Status)(uintptr_t)this;
    }
    pFVar13 = Proto3Type::MustHaveField(desc,4);
    sVar14 = UntypedMessage::Count(msg,(pFVar13->raw_->field_0)._impl_.number_);
    if (sVar14 != 0) {
      UnparseProto3Type::GetBool((UnparseProto3Type *)&local_f0.status_,pFVar13,msg,0);
      *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_f0;
      if (((ulong)local_f0 & 1) == 0) {
        LOCK();
        *(int *)local_f0 = *(int *)local_f0 + 1;
        UNLOCK();
      }
      if (*(long *)this != 1) {
LAB_002d491b:
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                  ((StatusOrData<bool> *)&local_f0.status_);
        return (Status)(uintptr_t)this;
      }
      absl::lts_20240722::Status::~Status((Status *)this);
      if (local_f0 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
        pcVar18 = "false";
        if (((ulong)local_e8 & 0xff) != 0) {
          pcVar18 = "true";
        }
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                  (&writer->sink_,pcVar18,(ulong)local_e8 & 0xff ^ 5);
        *(undefined8 *)this = 1;
        goto LAB_002d491b;
      }
      goto LAB_002d4f3c;
    }
    pJVar15 = (JsonWriter *)Proto3Type::MustHaveField(desc,5);
    sVar14 = UntypedMessage::Count
                       (msg,(((Field *)(pJVar15->sink_).buffer_)->field_0)._impl_.number_);
    if (sVar14 != 0) {
      UnparseProto3Type::GetMessage((UnparseProto3Type *)&local_f0.status_,(Field)pJVar15,msg,0);
      *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_f0;
      if (((ulong)local_f0 & 1) == 0) {
        LOCK();
        *(int *)local_f0 = *(int *)local_f0 + 1;
        UNLOCK();
      }
      if (*(long *)this == 1) {
        absl::lts_20240722::Status::~Status((Status *)this);
        body_00.x = (StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> *)writer;
        body_00.writer = pJVar15;
        Proto3Type::
        WithFieldType<google::protobuf::json_internal::(anonymous_namespace)::WriteValue<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&,bool)::_lambda(google::protobuf::json_internal::ResolverPool::Message_const&)_1_>
                  ((Field)this,body_00);
      }
LAB_002d4e65:
      absl::lts_20240722::internal_statusor::
      StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::~StatusOrData
                ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)
                 &local_f0.status_);
      return (Status)(uintptr_t)this;
    }
    pJVar15 = (JsonWriter *)Proto3Type::MustHaveField(desc,6);
    sVar14 = UntypedMessage::Count
                       (msg,(((Field *)(pJVar15->sink_).buffer_)->field_0)._impl_.number_);
    if (sVar14 != 0) {
      UnparseProto3Type::GetMessage((UnparseProto3Type *)&local_f0.status_,(Field)pJVar15,msg,0);
      *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_f0;
      if (((ulong)local_f0 & 1) == 0) {
        LOCK();
        *(int *)local_f0 = *(int *)local_f0 + 1;
        UNLOCK();
      }
      if (*(long *)this == 1) {
        absl::lts_20240722::Status::~Status((Status *)this);
        body_01.x = (StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> *)writer;
        body_01.writer = pJVar15;
        Proto3Type::
        WithFieldType<google::protobuf::json_internal::(anonymous_namespace)::WriteValue<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&,bool)::_lambda(google::protobuf::json_internal::ResolverPool::Message_const&)_2_>
                  ((Field)this,body_01);
      }
      goto LAB_002d4e65;
    }
LAB_002d4e84:
    if ((char)sVar17 == '\0') {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/json/internal/unparser.cc"
                 ,0x22b,0xc,"is_top_level");
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (&local_f0,0x81,
                 "empty, non-top-level Value must be handled one layer up, since it prints an empty string; reaching this statement is always a bug"
                );
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_f0.status_);
    }
    goto LAB_002d4476;
  default:
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
    writer->indent_ = writer->indent_ + 1;
    local_f0.status_.rep_._0_1_ = 1;
    WriteFields<google::protobuf::json_internal::UnparseProto3Type>
              (this,writer,msg,desc,(bool *)&local_f0);
    if (*(long *)this != 1) {
      return (Status)(uintptr_t)this;
    }
    writer->indent_ = writer->indent_ + -1;
    if (local_f0.status_.rep_._0_1_ == '\0') {
      JsonWriter::NewLine(writer);
    }
    pcVar18 = "}";
    sVar17 = 1;
    goto LAB_002d4471;
  case kTimestamp:
    pFVar13 = Proto3Type::MustHaveField(desc,1);
    sVar17 = UntypedMessage::Count(msg,(pFVar13->raw_->field_0)._impl_.number_);
    if (sVar17 == 0) {
      local_138 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0;
      local_140 = (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                   )0x1;
    }
    else {
      UnparseProto3Type::GetInt64((UnparseProto3Type *)&local_140.status_,pFVar13,msg,0);
    }
    *(anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
      *)this = local_140;
    if (((ulong)local_140 & 1) == 0) {
      LOCK();
      *(int *)local_140 = *(int *)local_140 + 1;
      UNLOCK();
    }
    if (local_140 ==
        (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
         )0x1) {
      if ((long)local_138 < -0xe7791f700) {
        pcVar18 = "minimum acceptable time value is 0001-01-01T00:00:00Z";
      }
      else {
        if ((long)local_138 < 0x3afff44180) {
          local_138 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                      ((long)local_138 + 0xe7791f700);
          pFVar13 = Proto3Type::MustHaveField(desc,2);
          sVar17 = UntypedMessage::Count(msg,(pFVar13->raw_->field_0)._impl_.number_);
          if (sVar17 == 0) {
            uStack_120 = uStack_120 & 0xffffffff00000000;
            local_128 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1;
          }
          else {
            UnparseProto3Type::GetInt32((UnparseProto3Type *)&local_128.status_,pFVar13,msg,0);
          }
          *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_128;
          if (((ulong)local_128 & 1) == 0) {
            LOCK();
            *(int *)local_128 = *(int *)local_128 + 1;
            UNLOCK();
          }
          if (local_128 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
            if (local_140 !=
                (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                 )0x1) goto LAB_002d4f11;
            iVar11 = (int)(SUB168(SEXT816((long)local_138) * SEXT816(0x1845c8a0ce512957),8) >> 0xd);
            iVar23 = SUB164(SEXT816((long)local_138) * SEXT816(0x1845c8a0ce512957),0xc) >> 0x1f;
            iVar3 = ((iVar11 - iVar23) * 4 + 0x6d40ac) / 0x23ab1;
            iVar9 = iVar3 * 0x23ab1;
            iVar10 = iVar9 + 3;
            iVar9 = iVar9 + 6;
            if (-1 < iVar10) {
              iVar9 = iVar10;
            }
            iVar23 = ((iVar11 - iVar23) + 0x1b502b) - (iVar9 >> 2);
            iVar10 = iVar23 * 4000;
            iVar10 = (int)((ulong)((long)(iVar10 + 4000) * -0x48441d23) >> 0x20) + iVar10 + 4000;
            iVar9 = (iVar10 >> 0x14) - (iVar10 >> 0x1f);
            iVar11 = iVar9 * 0x5b5;
            iVar10 = iVar11 + 3;
            if (-1 < iVar11) {
              iVar10 = iVar11;
            }
            lVar4 = (long)local_138 / 0xe10;
            iVar23 = (iVar23 - (iVar10 >> 2)) + 0x1f;
            iVar10 = iVar23 * 0x50;
            iVar11 = iVar10 / 0x98f;
            iVar26 = (int)((ulong)((long)(iVar11 * 0x98f) * -0x66666667) >> 0x20);
            uVar20 = (iVar23 - (iVar26 >> 0x1f)) + (iVar26 >> 5);
            iVar10 = iVar10 / 0x6925;
            aStack_e0.status_.rep_._0_4_ = iVar11 + iVar10 * -0xc + 2;
            uVar16 = (iVar3 * 100 + iVar9 + iVar10) - 0x1324;
            local_b0 = ((long)local_138 / 0x3c) % 0x3c;
            local_c0 = lVar4 + (((ulong)(lVar4 / 6 + (lVar4 >> 0x3f)) >> 2) - (lVar4 >> 0x3f)) *
                               -0x18;
            if ((uint)uStack_120 == 0) {
              local_f0.status_.rep_._4_4_ = 0;
              local_f0.status_.rep_._0_4_ = uVar16;
              local_e8 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                         absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
              aStack_e0.status_.rep_._4_4_ = 0;
              local_d8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
              local_d0 = (ulong)uVar20;
              local_c8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
              local_c0 = local_c0 & 0xffffffff;
              local_b8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
              local_b0 = local_b0 & 0xffffffff;
              local_a8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
              local_a0 = (long)local_138 % 0x3c & 0xffffffff;
              local_98 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
              absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                        (&local_118,"\"%04d-%02d-%02dT%02d:%02d:%02dZ\"",0x20,&local_f0,6);
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                        (&writer->sink_,(char *)local_118,(size_t)aStack_110);
            }
            else {
              uVar2 = -(uint)uStack_120;
              if (0 < (int)(uint)uStack_120) {
                uVar2 = (uint)uStack_120;
              }
              local_90 = 9;
              uVar24 = uVar2 * 0x26e978d5 >> 3 | uVar2 * -0x60000000;
              local_80 = (ulong)uVar2;
              while (uVar24 < 0x418938) {
                local_90 = local_90 + -3;
                iVar10 = (int)(local_80 / 1000);
                local_80 = local_80 / 1000;
                uVar24 = (uint)(iVar10 * 0x26e978d5) >> 3 | iVar10 * -0x60000000;
              }
              local_f0.status_.rep_._4_4_ = 0;
              local_f0.status_.rep_._0_4_ = uVar16;
              local_e8 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                         absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
              aStack_e0.status_.rep_._4_4_ = 0;
              local_d8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
              local_d0 = (ulong)uVar20;
              local_c8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
              local_c0 = local_c0 & 0xffffffff;
              local_b8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
              local_b0 = local_b0 & 0xffffffff;
              local_a8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
              local_a0 = (long)local_138 % 0x3c & 0xffffffff;
              local_98 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
              local_88 = absl::lts_20240722::str_format_internal::FormatArgImpl::
                         Dispatch<unsigned_long>;
              local_78 = absl::lts_20240722::str_format_internal::FormatArgImpl::
                         Dispatch<unsigned_int>;
              absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                        (&local_118,"\"%04d-%02d-%02dT%02d:%02d:%02d.%.*dZ\"",0x25,&local_f0,8);
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                        (&writer->sink_,(char *)local_118,(size_t)aStack_110);
            }
LAB_002d4cab:
            aVar21 = local_118;
            if (local_118 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&local_108) {
LAB_002d4cbe:
              operator_delete((void *)aVar21,(long)local_108 + 1);
            }
LAB_002d4cc6:
            *(undefined8 *)this = 1;
          }
          goto LAB_002d4ccd;
        }
        pcVar18 = "maximum acceptable time value is 9999-12-31T23:59:59Z";
      }
      absl::lts_20240722::InvalidArgumentError(this,0x35,pcVar18);
    }
    goto LAB_002d4cd7;
  case kDuration:
    pFVar13 = Proto3Type::MustHaveField(desc,1);
    sVar17 = UntypedMessage::Count(msg,(pFVar13->raw_->field_0)._impl_.number_);
    if (sVar17 == 0) {
      local_138 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0;
      local_140 = (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                   )0x1;
    }
    else {
      UnparseProto3Type::GetInt64((UnparseProto3Type *)&local_140.status_,pFVar13,msg,0);
    }
    *(anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
      *)this = local_140;
    if (((ulong)local_140 & 1) == 0) {
      LOCK();
      *(int *)local_140 = *(int *)local_140 + 1;
      UNLOCK();
    }
    if (local_140 ==
        (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
         )0x1) {
      if ((long)local_138 - 0x4979cb9e01U < 0xffffff6d0c68c3ff) {
        absl::lts_20240722::InvalidArgumentError(this,0x15,"duration out of range");
      }
      else {
        pFVar13 = Proto3Type::MustHaveField(desc,2);
        sVar17 = UntypedMessage::Count(msg,(pFVar13->raw_->field_0)._impl_.number_);
        if (sVar17 == 0) {
          uStack_120 = uStack_120 & 0xffffffff00000000;
          local_128 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1;
        }
        else {
          UnparseProto3Type::GetInt32((UnparseProto3Type *)&local_128.status_,pFVar13,msg,0);
        }
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_128;
        if (((ulong)local_128 & 1) == 0) {
          LOCK();
          *(int *)local_128 = *(int *)local_128 + 1;
          UNLOCK();
        }
        if (local_128 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          if ((uint)uStack_120 + 0xc4653600 < 0x88ca6c01) {
            pcVar18 = "duration out of range";
            uVar19 = 0x15;
          }
          else {
            if (local_140 !=
                (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                 )0x1) goto LAB_002d4f25;
            if (((uint)uStack_120 == 0 ||
                 local_138 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0) ||
               ((uint)uStack_120 >> 0x1f == -(local_138._4_4_ >> 0x1f))) {
              if ((uint)uStack_120 != 0) {
                uVar16 = -(uint)uStack_120;
                if (0 < (int)(uint)uStack_120) {
                  uVar16 = (uint)uStack_120;
                }
                local_d0 = 9;
                uVar20 = uVar16 * 0x26e978d5 >> 3 | uVar16 * -0x60000000;
                local_c0 = (ulong)uVar16;
                while (uVar20 < 0x418938) {
                  local_d0 = local_d0 - 3;
                  iVar10 = (int)(local_c0 / 1000);
                  local_c0 = local_c0 / 1000;
                  uVar20 = (uint)(iVar10 * 0x26e978d5) >> 3 | iVar10 * -0x60000000;
                }
                local_38 = "";
                if ((int)(uint)uStack_120 < 0 || (long)local_138 < 0) {
                  local_38 = "-";
                }
                local_40 = (Field)(ulong)((int)(uint)uStack_120 < 0 || (long)local_138 < 0);
                local_f0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&local_40;
                aStack_e0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)-(long)local_138;
                if (0 < (long)local_138) {
                  aStack_e0 = local_138;
                }
                local_e8 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                           absl::lts_20240722::str_format_internal::FormatArgImpl::
                           Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
                local_d8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<long>;
                local_c8 = absl::lts_20240722::str_format_internal::FormatArgImpl::
                           Dispatch<unsigned_long>;
                local_b8 = absl::lts_20240722::str_format_internal::FormatArgImpl::
                           Dispatch<unsigned_int>;
                absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                          (&local_118,"\"%s%d.%.*ds\"",0xc,&local_f0,4);
                io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                          (&writer->sink_,(char *)local_118,(size_t)aStack_110);
                goto LAB_002d4cab;
              }
              local_118.status_.rep_ = (Status)(Status)local_138;
              aStack_110 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                           absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<long>;
              absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                        (&local_f0,"\"%ds\"",5,&local_118,1);
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                        (&writer->sink_,(char *)local_f0,(size_t)local_e8);
              local_108 = aStack_e0;
              aVar21 = local_f0;
              if (local_f0 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&aStack_e0)
              goto LAB_002d4cbe;
              goto LAB_002d4cc6;
            }
            pcVar18 = "nanos and seconds signs do not match";
            uVar19 = 0x24;
          }
          absl::lts_20240722::InvalidArgumentError(this,uVar19,pcVar18);
        }
LAB_002d4ccd:
        absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
                  ((StatusOrData<int> *)&local_128.status_);
      }
    }
LAB_002d4cd7:
    absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
              ((StatusOrData<long> *)&local_140.status_);
    break;
  case kFieldMask:
    local_50 = Proto3Type::MustHaveField(desc,1);
    sVar17 = UntypedMessage::Count(msg,(local_50->raw_->field_0)._impl_.number_);
    local_f0.status_.rep_._0_1_ = 0x22;
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,(char *)&local_f0,1);
    local_60 = sVar17;
    if (sVar17 != 0) {
      local_58 = &writer->scratch_buf_;
      local_f4 = (uint)CONCAT71((int7)((ulong)local_58 >> 8),1);
      sVar17 = 0;
      local_70 = this;
      local_68 = msg;
      do {
        msg_00 = local_68;
        this = local_70;
        if ((local_f4 & 1) == 0) {
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,",",1);
        }
        else {
          local_f4 = 0;
        }
        UnparseProto3Type::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_f0.status_,local_50,local_58,msg_00,sVar17);
        aVar6 = aStack_e0;
        aVar21 = local_e8;
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)&this->field_0x0 = local_f0;
        if (((ulong)local_f0 & 1) == 0) {
          LOCK();
          *(int *)local_f0 = *(int *)local_f0 + 1;
          UNLOCK();
        }
        if (*(long *)this != 1) goto LAB_002d4651;
        if (local_f0 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_f0.status_);
          goto LAB_002d4e84;
        }
        local_48 = sVar17;
        if (local_e8 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0) {
          aVar25 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0;
          bVar5 = false;
          do {
            bVar1 = *(byte *)((long)aVar6 + (long)aVar25);
            if (((byte)(bVar1 + 0x9f) < 0x1a) && (bVar5)) {
              local_118.status_.rep_._0_1_ =
                   *(undefined1 *)
                    ((long)&absl::lts_20240722::ascii_internal::kToUpper + (ulong)bVar1);
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                        (&writer->sink_,(char *)&local_118,1);
LAB_002d4261:
              uVar16 = 0;
              bVar7 = false;
            }
            else {
              if (((byte)(bVar1 + 0x9f) < 0x1a) || ((bVar1 == 0x2e || ((byte)(bVar1 - 0x30) < 10))))
              {
                local_118.status_.rep_._0_1_ = bVar1;
                io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                          (&writer->sink_,(char *)&local_118,1);
                goto LAB_002d4261;
              }
              if (bVar1 == 0x5f) {
                uVar16 = 8;
                bVar7 = true;
                if ((bVar5) && ((writer->options_).allow_legacy_syntax == false)) goto LAB_002d4208;
              }
              else {
LAB_002d4208:
                if ((writer->options_).allow_legacy_syntax != false) {
                  if (bVar5) {
                    local_118.status_.rep_._0_1_ = 0x5f;
                    io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                              (&writer->sink_,(char *)&local_118,1);
                  }
                  local_118.status_.rep_._0_1_ = bVar1;
                  io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                            (&writer->sink_,(char *)&local_118,1);
                  goto LAB_002d4261;
                }
                uVar16 = 1;
                absl::lts_20240722::InvalidArgumentError
                          (local_70,0x21,"unexpected character in FieldMask");
                bVar7 = bVar5;
              }
            }
            bVar5 = bVar7;
            if ((uVar16 & 7) != 0) goto LAB_002d42a6;
            aVar25 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)((long)aVar25 + 1);
          } while (aVar21 != aVar25);
        }
        uVar16 = 7;
LAB_002d42a6:
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                  ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_f0.status_);
        if ((uVar16 != 7) && (uVar16 != 0)) {
          return (Status)(uintptr_t)local_70;
        }
        sVar17 = local_48 + 1;
        this = local_70;
      } while (sVar17 != local_60);
    }
    pcVar18 = (char *)&local_f0;
    local_f0.status_.rep_._0_1_ = 0x22;
    sVar17 = 1;
LAB_002d4471:
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,pcVar18,sVar17);
LAB_002d4476:
    *(long *)this = 1;
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteMessage(JsonWriter& writer, const Msg<Traits>& msg,
                          const Desc<Traits>& desc, bool is_top_level) {
  switch (ClassifyMessage(Traits::TypeName(desc))) {
    case MessageType::kAny:
      return WriteAny<Traits>(writer, msg, desc);
    case MessageType::kWrapper: {
      auto field = Traits::MustHaveField(desc, 1);
      if (Traits::GetSize(field, msg) == 0) {
        return WriteSingular<Traits>(writer, field);
      }
      return WriteSingular<Traits>(writer, field, msg);
    }
    case MessageType::kValue:
      return WriteValue<Traits>(writer, msg, desc, is_top_level);
    case MessageType::kStruct:
      return WriteStructValue<Traits>(writer, msg, desc);
    case MessageType::kList:
      return WriteListValue<Traits>(writer, msg, desc);
    case MessageType::kTimestamp:
      return WriteTimestamp<Traits>(writer, msg, desc);
    case MessageType::kDuration:
      return WriteDuration<Traits>(writer, msg, desc);
    case MessageType::kFieldMask:
      return WriteFieldMask<Traits>(writer, msg, desc);
    default: {
      writer.Write("{");
      writer.Push();
      bool first = true;
      RETURN_IF_ERROR(WriteFields<Traits>(writer, msg, desc, first));
      writer.Pop();
      if (!first) {
        writer.NewLine();
      }
      writer.Write("}");
      return absl::OkStatus();
    }
  }
}